

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

void __thiscall
ThreadParser::SAX2Handler::startElement
          (SAX2Handler *this,XMLCh *param_1,XMLCh *localname,XMLCh *param_3,Attributes *attributes)

{
  XMLCh XVar1;
  long lVar2;
  ushort *puVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  
  uVar7 = (uint)(ushort)*localname;
  if (*localname != L'\0') {
    param_3 = (XMLCh *)(ulong)(uint)this->SAX2Instance->fCheckSum;
    localname = localname + 1;
    do {
      uVar4 = (int)param_3 * 5 + uVar7;
      param_3 = (XMLCh *)(ulong)uVar4;
      XVar1 = *localname;
      uVar7 = (uint)(ushort)XVar1;
      localname = localname + 1;
    } while (XVar1 != L'\0');
    this->SAX2Instance->fCheckSum = uVar4;
  }
  lVar2 = (**(code **)(*(long *)attributes + 0x10))(attributes,uVar7,localname,param_3);
  if (lVar2 != 0) {
    lVar8 = 0;
    do {
      puVar3 = (ushort *)(**(code **)(*(long *)attributes + 0x28))(attributes,lVar8);
      uVar6 = *puVar3;
      if (uVar6 != 0) {
        iVar5 = this->SAX2Instance->fCheckSum;
        do {
          puVar3 = puVar3 + 1;
          iVar5 = iVar5 * 5 + (uint)uVar6;
          uVar6 = *puVar3;
        } while (uVar6 != 0);
        this->SAX2Instance->fCheckSum = iVar5;
      }
      puVar3 = (ushort *)(**(code **)(*(long *)attributes + 0x38))(attributes,lVar8);
      uVar6 = *puVar3;
      if (uVar6 != 0) {
        iVar5 = this->SAX2Instance->fCheckSum;
        do {
          puVar3 = puVar3 + 1;
          iVar5 = iVar5 * 5 + (uint)uVar6;
          uVar6 = *puVar3;
        } while (uVar6 != 0);
        this->SAX2Instance->fCheckSum = iVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void ThreadParser::SAX2Handler::startElement(const XMLCh *const /*uri*/,
                              const XMLCh *const localname,
                              const XMLCh *const /*qname*/,
                              const Attributes& attributes)
{
    SAX2Instance->addToCheckSum(localname);

    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getQName(i);
        SAX2Instance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAX2Instance->addToCheckSum(attVal);
    }
}